

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void addliteral(lua_State *L,luaL_Buffer *b,int arg)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  char *__format;
  lua_Number lVar5;
  char *format;
  lua_Integer n_1;
  lua_Number n;
  int nb;
  char *buff;
  char *s;
  size_t len;
  luaL_Buffer *plStack_18;
  int arg_local;
  luaL_Buffer *b_local;
  lua_State *L_local;
  
  len._4_4_ = arg;
  plStack_18 = b;
  b_local = (luaL_Buffer *)L;
  uVar1 = lua_type(L,arg);
  if (uVar1 < 2) {
    luaL_tolstring((lua_State *)b_local,len._4_4_,(size_t *)0x0);
    luaL_addvalue(plStack_18);
  }
  else if (uVar1 == 3) {
    pcVar3 = luaL_prepbuffsize(plStack_18,0x1ac);
    iVar2 = lua_isinteger((lua_State *)b_local,len._4_4_);
    if (iVar2 == 0) {
      lVar5 = lua_tonumberx((lua_State *)b_local,len._4_4_,(int *)0x0);
      n._4_4_ = snprintf(pcVar3,0x1ac,"%a",lVar5);
      checkdp(pcVar3,n._4_4_);
    }
    else {
      lVar4 = lua_tointegerx((lua_State *)b_local,len._4_4_,(int *)0x0);
      __format = "%lld";
      if (lVar4 == -0x8000000000000000) {
        __format = "0x%llx";
      }
      n._4_4_ = snprintf(pcVar3,0x1ac,__format,lVar4);
    }
    plStack_18->n = (long)n._4_4_ + plStack_18->n;
  }
  else if (uVar1 == 4) {
    pcVar3 = lua_tolstring((lua_State *)b_local,len._4_4_,(size_t *)&s);
    addquoted(plStack_18,pcVar3,(size_t)s);
  }
  else {
    luaL_argerror((lua_State *)b_local,len._4_4_,"value has no literal form");
  }
  return;
}

Assistant:

static void addliteral(lua_State *L, luaL_Buffer *b, int arg) {
    switch (lua_type(L, arg)) {
        case LUA_TSTRING: {
            size_t len;
            const char *s = lua_tolstring(L, arg, &len);
            addquoted(b, s, len);
            break;
        }
        case LUA_TNUMBER: {
            char *buff = luaL_prepbuffsize(b, MAX_ITEM);
            int nb;
            if (!lua_isinteger(L, arg)) {  /* float? */
                lua_Number n = lua_tonumber(L, arg);  /* write as hexa ('%a') */
                nb = lua_number2strx(L, buff, MAX_ITEM, "%"
                        LUA_NUMBER_FRMLEN
                        "a", n);
                checkdp(buff, nb);  /* ensure it uses a dot */
            } else {  /* integers */
                lua_Integer n = lua_tointeger(L, arg);
                const char *format = (n == LUA_MININTEGER)  /* corner case? */
                                     ? "0x%" LUA_INTEGER_FRMLEN "x"  /* use hexa */
                                     : LUA_INTEGER_FMT;  /* else use default format */
                nb = l_sprintf(buff, MAX_ITEM, format, (LUAI_UACINT) n);
            }
            luaL_addsize(b, nb);
            break;
        }
        case LUA_TNIL:
        case LUA_TBOOLEAN: {
            luaL_tolstring(L, arg, NULL);
            luaL_addvalue(b);
            break;
        }
        default: {
            luaL_argerror(L, arg, "value has no literal form");
        }
    }
}